

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spec_reporter.h
# Opt level: O0

void __thiscall bandit::detail::spec_reporter::test_run_complete(spec_reporter *this)

{
  uint specs_succeeded;
  size_t __n;
  void *__buf;
  undefined1 local_58 [8];
  test_run_summary summary;
  spec_reporter *this_local;
  
  summary.colorizer_ = (colorizer *)this;
  progress_reporter::test_run_complete(&this->super_progress_reporter);
  std::ostream::operator<<(this->stm_,std::endl<char,std::char_traits<char>>);
  specs_succeeded = (this->super_progress_reporter).specs_succeeded_;
  __n = (size_t)specs_succeeded;
  test_run_summary::test_run_summary
            ((test_run_summary *)local_58,(this->super_progress_reporter).specs_run_,
             (this->super_progress_reporter).specs_failed_,specs_succeeded,
             (this->super_progress_reporter).specs_skipped_,
             &(this->super_progress_reporter).failures_,
             &(this->super_progress_reporter).test_run_errors_,this->colorizer_);
  test_run_summary::write((test_run_summary *)local_58,(int)this->stm_,__buf,__n);
  std::ostream::flush();
  test_run_summary::~test_run_summary((test_run_summary *)local_58);
  return;
}

Assistant:

void test_run_complete() 
    {
      progress_reporter::test_run_complete();

      stm_ << std::endl;

      test_run_summary summary(specs_run_, specs_failed_, specs_succeeded_, specs_skipped_, failures_, 
          test_run_errors_, colorizer_);
      summary.write(stm_);
      stm_.flush();
    }